

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool QMetaType::canView(QMetaType fromType,QMetaType toType)

{
  int iVar1;
  QMetaType QVar2;
  QMetaTypeInterface *in_RSI;
  long in_FS_OFFSET;
  function<bool_(void_*,_void_*)> *f;
  int toTypeId;
  int fromTypeId;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffff98;
  int iVar3;
  undefined4 in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar4;
  pair<int,_int> in_stack_ffffffffffffffc8;
  pair<int,_int> local_28;
  int local_20;
  int local_1c;
  QMetaType local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.d_ptr = in_RSI;
  local_1c = id((QMetaType *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff8c);
  local_20 = id((QMetaType *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff8c);
  if ((local_1c == 0) || (local_20 == 0)) {
    bVar4 = false;
  }
  else {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesMutableViewRegistry>_>
    ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesMutableViewRegistry>_>
                  *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_28,&local_1c,&local_20);
    QVar2.d_ptr = (QMetaTypeInterface *)
                  QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>
                  ::function((QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
                              *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             in_stack_ffffffffffffffc8);
    if (QVar2.d_ptr == (QMetaTypeInterface *)0x0) {
      iVar3 = local_20;
      iVar1 = qMetaTypeId<QSequentialIterable>();
      if (iVar3 == iVar1) {
        bVar4 = canImplicitlyViewAsSequentialIterable(QVar2);
      }
      else {
        iVar3 = local_20;
        iVar1 = qMetaTypeId<QAssociativeIterable>();
        if (iVar3 == iVar1) {
          bVar4 = canImplicitlyViewAsAssociativeIterable(QVar2);
        }
        else {
          QVar2.d_ptr._7_1_ = in_stack_ffffffffffffffb7;
          QVar2.d_ptr._0_7_ = in_stack_ffffffffffffffb0;
          bVar4 = canConvertMetaObject(local_18,QVar2);
          if (bVar4) {
            bVar4 = true;
          }
          else {
            bVar4 = false;
          }
        }
      }
    }
    else {
      bVar4 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaType::canView(QMetaType fromType, QMetaType toType)
{
    int fromTypeId = fromType.id();
    int toTypeId = toType.id();

    if (fromTypeId == UnknownType || toTypeId == UnknownType)
        return false;

    const auto f = customTypesMutableViewRegistry()->function({fromTypeId, toTypeId});
    if (f)
        return true;

    if (toTypeId == qMetaTypeId<QSequentialIterable>())
        return canImplicitlyViewAsSequentialIterable(fromType);

    if (toTypeId == qMetaTypeId<QAssociativeIterable>())
        return canImplicitlyViewAsAssociativeIterable(fromType);

    if (canConvertMetaObject(fromType, toType))
        return true;

    return false;
}